

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

bool global_collect_tree(Node *node,IdentTree *tree)

{
  char *pcVar1;
  value_type pNVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  void *pvVar6;
  reference ppNVar7;
  IdentTree *this;
  IdentTree *pIVar8;
  size_type sVar9;
  Node *in_RSI;
  long in_RDI;
  IdentTree *subTree_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path_4;
  Node *cur_1;
  size_t i_1;
  bool isClass;
  IdentTree *subTree_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path_3;
  Node *classNode;
  Node *nameNode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path_2;
  IdentTree *subTree_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path_1;
  Node *cur;
  size_t i;
  IdentTree *subTree;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::nullptr_t>
  *in_stack_fffffffffffffdf8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentTree_*>_>_>
  *in_stack_fffffffffffffe00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea0;
  IdentTree *in_stack_fffffffffffffea8;
  IdentTree *in_stack_fffffffffffffeb0;
  IdentTree *tree_00;
  value_type in_stack_fffffffffffffef8;
  allocator local_d9;
  string local_d8 [96];
  void *local_78;
  value_type local_58;
  ulong local_50;
  void *local_38;
  IdentTree *in_stack_ffffffffffffffe0;
  bool local_1;
  
  if ((in_RDI == 0) || (in_RSI == (Node *)0x0)) {
    local_1 = false;
  }
  else {
    if ((*(int *)(in_RDI + 0x10) == 0xf) && (**(int **)(in_RDI + 8) == 0x25)) {
      std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x18),0);
      node_to_path_abi_cxx11_(in_stack_fffffffffffffef8);
      pvVar6 = operator_new(0x48);
      IdentTree::IdentTree
                ((IdentTree *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      local_38 = pvVar6;
      std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x18),1);
      bVar4 = global_collect_tree(in_RSI,in_stack_ffffffffffffffe0);
      pvVar6 = local_38;
      if (!bVar4) {
        if (local_38 != (void *)0x0) {
          IdentTree::~IdentTree
                    ((IdentTree *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
          operator_delete(pvVar6);
        }
        local_38 = (void *)0x0;
      }
      set_sub_tree_by_path
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe00);
    }
    else if (*(int *)(in_RDI + 0x10) == 0x21) {
      for (local_50 = 0; uVar3 = local_50,
          sVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                            ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x18)),
          uVar3 < sVar9; local_50 = local_50 + 1) {
        ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                            ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x18),local_50);
        local_58 = *ppNVar7;
        if (local_58 != (value_type)0x0) {
          if (((local_58->nodeType == PNT_BINARY_OP) && (local_58->tok->type == TK_NEWSLOT)) ||
             (((local_58->nodeType == PNT_CLASS || (local_58->nodeType == PNT_LOCAL_CLASS)) &&
              (ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                   (&local_58->children,0), *ppNVar7 != (value_type)0x0)))) {
            std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_58->children,0);
            node_to_path_abi_cxx11_(in_stack_fffffffffffffef8);
            pvVar6 = operator_new(0x48);
            IdentTree::IdentTree
                      ((IdentTree *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
            local_78 = pvVar6;
            if (local_58->nodeType == PNT_BINARY_OP) {
              std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_58->children,1);
            }
            bVar4 = global_collect_tree(in_RSI,in_stack_ffffffffffffffe0);
            pvVar6 = local_78;
            if (!bVar4) {
              if (local_78 != (void *)0x0) {
                IdentTree::~IdentTree
                          ((IdentTree *)
                           CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
                operator_delete(pvVar6);
              }
              local_78 = (void *)0x0;
            }
            set_sub_tree_by_path
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0
                      );
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffe00);
          }
          if (local_58->nodeType == PNT_FUNCTION) {
            std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_58->children,0);
            node_to_path_abi_cxx11_(in_stack_fffffffffffffef8);
            set_sub_tree_by_path
                      (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0
                      );
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffe00);
          }
          if (local_58->nodeType == PNT_GLOBAL_ENUM) {
            ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                (&local_58->children,0);
            pcVar1 = ((*ppNVar7)->tok->u).s;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_d8,pcVar1,&local_d9);
            std::make_pair<std::__cxx11::string,decltype(nullptr)>
                      (&in_stack_fffffffffffffdf8->first,
                       (void **)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
            std::
            map<std::__cxx11::string,IdentTree*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,IdentTree*>>>
            ::insert<std::pair<std::__cxx11::string,decltype(nullptr)>>
                      (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::nullptr_t>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::nullptr_t>
                     *)0x133b7a);
            std::__cxx11::string::~string(local_d8);
            std::allocator<char>::~allocator((allocator<char> *)&local_d9);
          }
          if (local_58->nodeType == PNT_IF_ELSE) {
            std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_58->children,1);
            global_collect_tree(in_RSI,in_stack_ffffffffffffffe0);
            sVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&local_58->children);
            if (2 < sVar9) {
              std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&local_58->children,2);
              global_collect_tree(in_RSI,in_stack_ffffffffffffffe0);
            }
          }
          if (((local_58->nodeType == PNT_LOCAL_VAR_DECLARATION) &&
              (sVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&local_58->children),
              sVar9 != 0)) &&
             (ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                  (&local_58->children,0),
             (*ppNVar7)->nodeType == PNT_VAR_DECLARATOR)) {
            ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                (&local_58->children,0);
            sVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::size(&(*ppNVar7)->children);
            if (sVar9 == 2) {
              ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                  (&local_58->children,0);
              ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                  (&(*ppNVar7)->children,0);
              pNVar2 = *ppNVar7;
              ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                  (&local_58->children,0);
              ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                  (&(*ppNVar7)->children,1);
              in_stack_fffffffffffffef8 = *ppNVar7;
              if (((pNVar2 != (value_type)0x0) && (in_stack_fffffffffffffef8 != (value_type)0x0)) &&
                 ((in_stack_fffffffffffffef8->nodeType == PNT_CLASS &&
                  (ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                       (&in_stack_fffffffffffffef8->children,1),
                  *ppNVar7 != (value_type)0x0)))) {
                node_to_path_abi_cxx11_(in_stack_fffffffffffffef8);
                operator_new(0x48);
                IdentTree::IdentTree
                          ((IdentTree *)
                           CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
                global_collect_tree(in_RSI,in_stack_ffffffffffffffe0);
                set_sub_tree_by_path
                          (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                           in_stack_fffffffffffffea0);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffe00);
              }
            }
          }
        }
      }
      return true;
    }
    if (((*(int *)(in_RDI + 0x10) == 0x1a) || (*(int *)(in_RDI + 0x10) == 0x34)) ||
       (*(int *)(in_RDI + 0x10) == 0x35)) {
      bVar4 = true;
      if (*(int *)(in_RDI + 0x10) != 0x34) {
        bVar4 = *(int *)(in_RDI + 0x10) == 0x35;
      }
      if ((bVar4) &&
         (ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                              ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x18),1),
         *ppNVar7 != (value_type)0x0)) {
        std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                  ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x18),1);
        node_to_path_abi_cxx11_(in_stack_fffffffffffffef8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffe00,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffdf8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe00);
      }
      iVar5 = 0;
      if (bVar4) {
        iVar5 = 3;
      }
      this = (IdentTree *)(long)iVar5;
      while (tree_00 = this,
            pIVar8 = (IdentTree *)
                     std::vector<Node_*,_std::allocator<Node_*>_>::size
                               ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x18)),
            this < pIVar8) {
        ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                            ((vector<Node_*,_std::allocator<Node_*>_> *)(in_RDI + 0x18),
                             (size_type)tree_00);
        pIVar8 = (IdentTree *)*ppNVar7;
        if (((pIVar8 != (IdentTree *)0x0) &&
            (((*(int *)&(pIVar8->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
               8 || (*(int *)&(pIVar8->children)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent == 0x3b)) ||
             (*(int *)&(pIVar8->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
              0x3c)))) &&
           (ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                ((vector<Node_*,_std::allocator<Node_*>_> *)
                                 &(pIVar8->children)._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_left,0), *ppNVar7 != (value_type)0x0)) {
          std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                    ((vector<Node_*,_std::allocator<Node_*>_> *)
                     &(pIVar8->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0);
          node_to_path_abi_cxx11_(in_stack_fffffffffffffef8);
          pvVar6 = operator_new(0x48);
          IdentTree::IdentTree
                    ((IdentTree *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
          sVar9 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                            ((vector<Node_*,_std::allocator<Node_*>_> *)
                             &(pIVar8->children)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_left);
          if (sVar9 < 2) {
LAB_001340b0:
            if (pvVar6 != (void *)0x0) {
              IdentTree::~IdentTree
                        ((IdentTree *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0))
              ;
              operator_delete(pvVar6);
            }
          }
          else {
            std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                      ((vector<Node_*,_std::allocator<Node_*>_> *)
                       &(pIVar8->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,1);
            in_stack_fffffffffffffdf7 = global_collect_tree(in_RSI,in_stack_ffffffffffffffe0);
            if (!(bool)in_stack_fffffffffffffdf7) goto LAB_001340b0;
          }
          set_sub_tree_by_path(tree_00,pIVar8,in_stack_fffffffffffffea0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this);
        }
        this = (IdentTree *)&(tree_00->children)._M_t._M_impl.field_0x1;
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool global_collect_tree(Node * node, IdentTree * tree)
{
  if (!node || !tree)
    return false;

  if (node->nodeType == PNT_BINARY_OP && node->tok.type == TK_NEWSLOT)
  {
    vector<string> path = node_to_path(node->children[0]);
    IdentTree * subTree = new IdentTree;
    if (!global_collect_tree(node->children[1], subTree))
    {
      delete subTree;
      subTree = nullptr;
    }
    set_sub_tree_by_path(tree, subTree, path);
  }
  else if (node->nodeType == PNT_STATEMENT_LIST) // root
  {
    for (size_t i = 0; i < node->children.size(); i++)
    {
      Node * cur = node->children[i];
      if (!cur)
        continue;

      if ((cur->nodeType == PNT_BINARY_OP && cur->tok.type == TK_NEWSLOT) ||
        ((cur->nodeType == PNT_CLASS || cur->nodeType == PNT_LOCAL_CLASS) && cur->children[0]))
      {
        vector<string> path = node_to_path(cur->children[0]);
        IdentTree * subTree = new IdentTree;
        if (!global_collect_tree(cur->nodeType == PNT_BINARY_OP ? cur->children[1] : cur, subTree))
        {
          delete subTree;
          subTree = nullptr;
        }
        set_sub_tree_by_path(tree, subTree, path);
      }

      if (cur->nodeType == PNT_FUNCTION)
      {
        vector<string> path = node_to_path(cur->children[0]);
        set_sub_tree_by_path(tree, nullptr, path);
      }

      if (cur->nodeType == PNT_GLOBAL_ENUM)
      {
        ident_root.children.insert(make_pair(string(cur->children[0]->tok.u.s), nullptr));
      }

      if (cur->nodeType == PNT_IF_ELSE)
      {
        global_collect_tree(cur->children[1], tree);
        if (cur->children.size() > 2) // else-node
          global_collect_tree(cur->children[2], tree);
      }


      // local ClassName = class extends XXXX {}
      if (cur->nodeType == PNT_LOCAL_VAR_DECLARATION && cur->children.size() > 0 &&
        cur->children[0]->nodeType == PNT_VAR_DECLARATOR && cur->children[0]->children.size() == 2)
      {
        Node * nameNode = cur->children[0]->children[0];
        Node * classNode = cur->children[0]->children[1];
        if (nameNode && classNode && classNode->nodeType == PNT_CLASS && classNode->children[1]) // children[1] - extends
        {
          vector<string> path = node_to_path(nameNode);
          IdentTree * subTree = new IdentTree;
          global_collect_tree(classNode, subTree);
          set_sub_tree_by_path(tree, subTree, path);
        }
      }
    }
    return true;
  }

  if (node->nodeType == PNT_TABLE_CREATION || node->nodeType == PNT_CLASS || node->nodeType == PNT_LOCAL_CLASS)
  {
    bool isClass = (node->nodeType == PNT_CLASS || node->nodeType == PNT_LOCAL_CLASS);
    if (isClass && node->children[1])
      tree->extends = node_to_path(node->children[1]);

    for (size_t i = isClass ? 3 : 0; i < node->children.size(); i++)
    {
      Node * cur = node->children[i];
      if (!cur)
        continue;

      if (cur->nodeType == PNT_KEY_VALUE || cur->nodeType == PNT_CLASS_MEMBER || cur->nodeType == PNT_STATIC_CLASS_MEMBER)
        if (cur->children[0])
        {
          vector<string> path = node_to_path(cur->children[0]);
          IdentTree * subTree = new IdentTree;
          if (cur->children.size() < 2 || !global_collect_tree(cur->children[1], subTree))
          {
            delete subTree;
            subTree = nullptr;
          }
          set_sub_tree_by_path(tree, subTree, path);
        }
    }
    return true;
  }

  return false;
}